

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void P_SerializeWorld(FArchive *arc)

{
  side_t *psVar1;
  bool bVar2;
  uint uVar3;
  FArchive *pFVar4;
  FDynamicColormap *pFVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  line_t *plVar9;
  ulong uVar10;
  sector_t *p;
  zone_t *env;
  BYTE desaturate;
  BYTE sat;
  PalEntry fade;
  PalEntry color;
  byte local_3a;
  BYTE local_39;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_38;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_34;
  
  if (0 < numsectors) {
    iVar8 = 0;
    p = sectors;
    do {
      pFVar4 = operator<<(arc,&p->floorplane);
      operator<<(pFVar4,&p->ceilingplane);
      FArchive::operator<<(arc,(WORD *)&p->lightlevel);
      FArchive::operator<<(arc,(WORD *)&p->special);
      pFVar4 = FArchive::operator<<(arc,&p->soundtraversed);
      pFVar4 = FArchive::operator<<(pFVar4,(WORD *)&p->seqType);
      pFVar4 = FArchive::operator<<(pFVar4,&p->friction);
      pFVar4 = FArchive::operator<<(pFVar4,&p->movefactor);
      pFVar4 = FArchive::operator<<(pFVar4,(BYTE *)&p->stairlock);
      pFVar4 = FArchive::operator<<(pFVar4,(WORD *)&p->prevsec);
      pFVar4 = FArchive::operator<<(pFVar4,(WORD *)&p->nextsec);
      operator<<(pFVar4,p->planes);
      operator<<(pFVar4,p->planes + 1);
      pFVar4 = operator<<(pFVar4,&p->heightsec);
      pFVar4 = FArchive::operator<<(pFVar4,&p->bottommap);
      pFVar4 = FArchive::operator<<(pFVar4,&p->midmap);
      pFVar4 = FArchive::operator<<(pFVar4,&p->topmap);
      FArchive::operator<<(pFVar4,&p->gravity);
      P_SerializeTerrain(arc,p->terrainnum);
      P_SerializeTerrain(arc,p->terrainnum + 1);
      FArchive::operator<<(arc,(DWORD *)&p->damageamount);
      pFVar4 = FArchive::operator<<(arc,(WORD *)&p->damageinterval);
      pFVar4 = FArchive::operator<<(pFVar4,(WORD *)&p->leakydamage);
      pFVar4 = FArchive::operator<<(pFVar4,&(p->damagetype).super_FName);
      pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&p->sky);
      pFVar4 = FArchive::operator<<(pFVar4,&p->MoreFlags);
      pFVar4 = FArchive::operator<<(pFVar4,&p->Flags);
      pFVar4 = FArchive::operator<<(pFVar4,p->Portals);
      pFVar4 = FArchive::operator<<(pFVar4,p->Portals + 1);
      FArchive::operator<<(pFVar4,&p->ZoneNumber);
      pFVar4 = FArchive::SerializeObject
                         (arc,(DObject **)p->interpolations,DInterpolation::RegistrationInfo.MyClass
                         );
      pFVar4 = FArchive::SerializeObject
                         (pFVar4,(DObject **)(p->interpolations + 1),
                          DInterpolation::RegistrationInfo.MyClass);
      pFVar4 = FArchive::SerializeObject
                         (pFVar4,(DObject **)(p->interpolations + 2),
                          DInterpolation::RegistrationInfo.MyClass);
      pFVar4 = FArchive::SerializeObject
                         (pFVar4,(DObject **)(p->interpolations + 3),
                          DInterpolation::RegistrationInfo.MyClass);
      FArchive::operator<<(pFVar4,&(p->SeqName).super_FName);
      extsector_t::Serialize(p->e,arc);
      if (arc->m_Storing == true) {
        pFVar5 = p->ColorMap;
        pFVar4 = FArchive::operator<<(arc,&(pFVar5->Color).field_0.field_0.a);
        pFVar4 = FArchive::operator<<(pFVar4,&(pFVar5->Color).field_0.field_0.r);
        pFVar4 = FArchive::operator<<(pFVar4,&(pFVar5->Color).field_0.field_0.g);
        pFVar4 = FArchive::operator<<(pFVar4,(BYTE *)&pFVar5->Color);
        pFVar5 = p->ColorMap;
        pFVar4 = FArchive::operator<<(pFVar4,&(pFVar5->Fade).field_0.field_0.a);
        pFVar4 = FArchive::operator<<(pFVar4,&(pFVar5->Fade).field_0.field_0.r);
        pFVar4 = FArchive::operator<<(pFVar4,&(pFVar5->Fade).field_0.field_0.g);
        FArchive::operator<<(pFVar4,(BYTE *)&pFVar5->Fade);
        local_39 = (BYTE)p->ColorMap->Desaturate;
        FArchive::operator<<(arc,&local_39);
      }
      else {
        pFVar4 = FArchive::operator<<(arc,&local_34.field_0.a);
        pFVar4 = FArchive::operator<<(pFVar4,&local_34.field_0.r);
        pFVar4 = FArchive::operator<<(pFVar4,&local_34.field_0.g);
        pFVar4 = FArchive::operator<<(pFVar4,(BYTE *)&local_34.d);
        pFVar4 = FArchive::operator<<(pFVar4,&local_38.field_0.a);
        pFVar4 = FArchive::operator<<(pFVar4,&local_38.field_0.r);
        pFVar4 = FArchive::operator<<(pFVar4,&local_38.field_0.g);
        pFVar4 = FArchive::operator<<(pFVar4,(BYTE *)&local_38.d);
        FArchive::operator<<(pFVar4,&local_3a);
        pFVar5 = GetSpecialLights((PalEntry)local_34.field_0,(PalEntry)local_38.field_0,
                                  (uint)local_3a);
        p->ColorMap = pFVar5;
      }
      pFVar4 = FArchive::operator<<(arc,p->reflect + 1);
      FArchive::operator<<(pFVar4,p->reflect);
      iVar8 = iVar8 + 1;
      p = p + 1;
    } while (iVar8 < numsectors);
  }
  if (0 < numlines) {
    iVar8 = 0;
    plVar9 = lines;
    do {
      pFVar4 = FArchive::operator<<(arc,&plVar9->flags);
      pFVar4 = FArchive::operator<<(pFVar4,&plVar9->activation);
      pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&plVar9->special);
      FArchive::operator<<(pFVar4,&plVar9->alpha);
      if ((plVar9->special - 0x50U < 6) || (plVar9->special == 0xe2)) {
        P_SerializeACSScriptNumber(arc,plVar9->args,false);
      }
      else {
        FArchive::operator<<(arc,(DWORD *)plVar9->args);
      }
      pFVar4 = FArchive::operator<<(arc,(DWORD *)(plVar9->args + 1));
      pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)(plVar9->args + 2));
      pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)(plVar9->args + 3));
      FArchive::operator<<(pFVar4,(DWORD *)(plVar9->args + 4));
      FArchive::operator<<(arc,&plVar9->portalindex);
      FArchive::operator<<(arc,&plVar9->portaltransferred);
      lVar6 = 0;
      bVar2 = true;
      do {
        bVar7 = bVar2;
        psVar1 = plVar9->sidedef[lVar6];
        if (psVar1 != (side_t *)0x0) {
          operator<<(arc,psVar1->textures);
          operator<<(arc,psVar1->textures + 1);
          operator<<(arc,psVar1->textures + 2);
          pFVar4 = FArchive::operator<<(arc,(WORD *)&psVar1->Light);
          pFVar4 = FArchive::operator<<(pFVar4,&psVar1->Flags);
          pFVar4 = FArchive::operator<<(pFVar4,&psVar1->LeftSide);
          pFVar4 = FArchive::operator<<(pFVar4,&psVar1->RightSide);
          FArchive::operator<<(pFVar4,(DWORD *)&psVar1->Index);
        }
        lVar6 = 1;
        bVar2 = false;
      } while (bVar7);
      iVar8 = iVar8 + 1;
      plVar9 = plVar9 + 1;
    } while (iVar8 < numlines);
  }
  FArchive::operator<<(arc,(DWORD *)&numzones);
  iVar8 = numzones;
  if (arc->m_Loading != false) {
    if (zones != (zone_t *)0x0) {
      operator_delete__(zones);
    }
    iVar8 = numzones;
    uVar10 = 0xffffffffffffffff;
    if (-1 < (long)numzones) {
      uVar10 = (long)numzones * 8;
    }
    zones = (zone_t *)operator_new__(uVar10);
  }
  if (0 < iVar8) {
    iVar8 = 0;
    env = zones;
    do {
      operator<<(arc,&env->Environment);
      iVar8 = iVar8 + 1;
      env = env + 1;
    } while (iVar8 < numzones);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,linePortals.Count);
    uVar3 = linePortals.Count;
  }
  else {
    uVar3 = FArchive::ReadCount(arc);
    if (linePortals.Count <= uVar3 && uVar3 - linePortals.Count != 0) {
      TArray<FLinePortal,_FLinePortal>::Grow(&linePortals,uVar3 - linePortals.Count);
    }
  }
  linePortals.Count = uVar3;
  if (linePortals.Count != 0) {
    lVar6 = 0;
    uVar10 = 0;
    do {
      operator<<(arc,(FLinePortal *)((long)&(linePortals.Array)->mOrigin + lVar6));
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 0x48;
    } while (uVar10 < linePortals.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,sectorPortals.Count);
    uVar3 = sectorPortals.Count;
  }
  else {
    uVar3 = FArchive::ReadCount(arc);
    if (sectorPortals.Count <= uVar3 && uVar3 - sectorPortals.Count != 0) {
      TArray<FSectorPortal,_FSectorPortal>::Grow(&sectorPortals,uVar3 - sectorPortals.Count);
    }
  }
  sectorPortals.Count = uVar3;
  if (sectorPortals.Count != 0) {
    lVar6 = 0;
    uVar10 = 0;
    do {
      operator<<(arc,(FSectorPortal *)((long)&(sectorPortals.Array)->mType + lVar6));
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 0x40;
    } while (uVar10 < sectorPortals.Count);
  }
  P_CollectLinkedPortals();
  return;
}

Assistant:

void P_SerializeWorld (FArchive &arc)
{
	int i, j;
	sector_t *sec;
	line_t *li;
	zone_t *zn;

	// do sectors
	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->floorplane
			<< sec->ceilingplane;
		arc << sec->lightlevel;
		arc << sec->special;
		arc << sec->soundtraversed
			<< sec->seqType
			<< sec->friction
			<< sec->movefactor
			<< sec->stairlock
			<< sec->prevsec
			<< sec->nextsec
			<< sec->planes[sector_t::floor]
			<< sec->planes[sector_t::ceiling]
			<< sec->heightsec
			<< sec->bottommap << sec->midmap << sec->topmap
			<< sec->gravity;
		P_SerializeTerrain(arc, sec->terrainnum[0]);
		P_SerializeTerrain(arc, sec->terrainnum[1]);
		arc << sec->damageamount;
		arc << sec->damageinterval
			<< sec->leakydamage
			<< sec->damagetype
			<< sec->sky
			<< sec->MoreFlags
			<< sec->Flags
			<< sec->Portals[sector_t::floor] << sec->Portals[sector_t::ceiling]
			<< sec->ZoneNumber;
		arc	<< sec->interpolations[0]
			<< sec->interpolations[1]
			<< sec->interpolations[2]
			<< sec->interpolations[3]
			<< sec->SeqName;

		sec->e->Serialize(arc);
		if (arc.IsStoring ())
		{
			arc << sec->ColorMap->Color
				<< sec->ColorMap->Fade;
			BYTE sat = sec->ColorMap->Desaturate;
			arc << sat;
		}
		else
		{
			PalEntry color, fade;
			BYTE desaturate;
			arc << color << fade
				<< desaturate;
			sec->ColorMap = GetSpecialLights (color, fade, desaturate);
		}
		// begin of GZDoom additions
		arc << sec->reflect[sector_t::ceiling] << sec->reflect[sector_t::floor];
		// end of GZDoom additions
	}

	// do lines
	for (i = 0, li = lines; i < numlines; i++, li++)
	{
		arc << li->flags
			<< li->activation
			<< li->special
			<< li->alpha;

		if (P_IsACSSpecial(li->special))
		{
			P_SerializeACSScriptNumber(arc, li->args[0], false);
		}
		else
		{
			arc << li->args[0];
		}
		arc << li->args[1] << li->args[2] << li->args[3] << li->args[4];

			arc << li->portalindex;
			arc << li->portaltransferred;	// GZDoom addition.

		for (j = 0; j < 2; j++)
		{
			if (li->sidedef[j] == NULL)
				continue;

			side_t *si = li->sidedef[j];
			arc << si->textures[side_t::top]
				<< si->textures[side_t::mid]
				<< si->textures[side_t::bottom]
				<< si->Light
				<< si->Flags
				<< si->LeftSide
				<< si->RightSide
				<< si->Index;
		}
	}

	// do zones
	arc << numzones;

	if (arc.IsLoading())
	{
		if (zones != NULL)
		{
			delete[] zones;
		}
		zones = new zone_t[numzones];
	}

	for (i = 0, zn = zones; i < numzones; ++i, ++zn)
	{
		arc << zn->Environment;
	}

	arc << linePortals << sectorPortals;
	P_CollectLinkedPortals();
}